

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CollationBuilder::findOrInsertNodeForRootCE
          (CollationBuilder *this,int64_t ce,int32_t strength,UErrorCode *errorCode)

{
  UBool UVar1;
  undefined4 local_34;
  uint32_t lower32;
  int32_t index;
  UErrorCode *errorCode_local;
  int32_t strength_local;
  int64_t ce_local;
  CollationBuilder *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    local_34 = findOrInsertNodeForPrimary(this,(uint32_t)((ulong)ce >> 0x20),errorCode);
    if (0 < strength) {
      local_34 = findOrInsertWeakNode(this,local_34,(uint)ce >> 0x10,1,errorCode);
      if (1 < strength) {
        local_34 = findOrInsertWeakNode(this,local_34,(uint)ce & 0x3f3f,2,errorCode);
      }
    }
    this_local._4_4_ = local_34;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
CollationBuilder::findOrInsertNodeForRootCE(int64_t ce, int32_t strength, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    U_ASSERT((uint8_t)(ce >> 56) != Collation::UNASSIGNED_IMPLICIT_BYTE);

    // Find or insert the node for each of the root CE's weights,
    // down to the requested level/strength.
    // Root CEs must have common=zero quaternary weights (for which we never insert any nodes).
    U_ASSERT((ce & 0xc0) == 0);
    int32_t index = findOrInsertNodeForPrimary((uint32_t)(ce >> 32), errorCode);
    if(strength >= UCOL_SECONDARY) {
        uint32_t lower32 = (uint32_t)ce;
        index = findOrInsertWeakNode(index, lower32 >> 16, UCOL_SECONDARY, errorCode);
        if(strength >= UCOL_TERTIARY) {
            index = findOrInsertWeakNode(index, lower32 & Collation::ONLY_TERTIARY_MASK,
                                         UCOL_TERTIARY, errorCode);
        }
    }
    return index;
}